

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptStringObject.cpp
# Opt level: O0

BOOL __thiscall
Js::JavascriptStringObject::GetDiagValueString
          (JavascriptStringObject *this,StringBuilder<Memory::ArenaAllocator> *stringBuilder,
          ScriptContext *requestContext)

{
  charcount_t countNeeded;
  JavascriptString *pJVar1;
  char16 *str;
  ScriptContext *requestContext_local;
  StringBuilder<Memory::ArenaAllocator> *stringBuilder_local;
  JavascriptStringObject *this_local;
  
  StringBuilder<Memory::ArenaAllocator>::Append(stringBuilder,L'\"');
  pJVar1 = InternalUnwrap(this);
  str = JavascriptString::GetString(pJVar1);
  pJVar1 = InternalUnwrap(this);
  countNeeded = JavascriptString::GetLength(pJVar1);
  StringBuilder<Memory::ArenaAllocator>::Append(stringBuilder,str,countNeeded);
  StringBuilder<Memory::ArenaAllocator>::Append(stringBuilder,L'\"');
  return 1;
}

Assistant:

BOOL JavascriptStringObject::GetDiagValueString(StringBuilder<ArenaAllocator>* stringBuilder, ScriptContext* requestContext)
    {
        stringBuilder->Append(_u('"'));
        stringBuilder->Append(this->InternalUnwrap()->GetString(), this->InternalUnwrap()->GetLength());
        stringBuilder->Append(_u('"'));
        return TRUE;
    }